

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity
          (Vector<kj::Own<capnp::_::SegmentBuilder>_> *this,size_t newSize)

{
  Own<capnp::_::SegmentBuilder> *pOVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Own<capnp::_::SegmentBuilder> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pOVar2 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pOVar1 = (this->builder).ptr; pOVar1 != pOVar2; pOVar1 = pOVar1 + 1) {
    (local_38.pos)->disposer = pOVar1->disposer;
    (local_38.pos)->ptr = pOVar1->ptr;
    pOVar1->ptr = (SegmentBuilder *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::operator=(&this->builder,&local_38);
  pOVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pOVar1 = local_38.ptr;
  if (local_38.ptr != (Own<capnp::_::SegmentBuilder> *)0x0) {
    local_38.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_38.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    local_38.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pOVar1,0x10,(long)pRVar3 - (long)pOVar1 >> 4,
               (long)pOVar2 - (long)pOVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }